

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

size_t __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::size
          (mpmc_blocking_queue<spdlog::details::async_msg> *this)

{
  size_t sVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  sVar1 = circular_q<spdlog::details::async_msg>::size
                    ((circular_q<spdlog::details::async_msg> *)(in_RDI + 0x11));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15b76f);
  return sVar1;
}

Assistant:

size_t size() {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        return q_.size();
    }